

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgram.h
# Opt level: O3

void __thiscall BamTools::SamProgram::~SamProgram(SamProgram *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->NextProgramID)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->NextProgramID).field_2) {
    operator_delete(pcVar1);
  }
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::~vector
            (&this->CustomTags);
  pcVar1 = (this->Version)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Version).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->PreviousProgramID)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->PreviousProgramID).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->Name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->Name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->ID)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->ID).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->CommandLine)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->CommandLine).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

struct API_EXPORT SamProgram
{

    // ctor & dtor
    SamProgram();
    SamProgram(const std::string& id);

    // query/modify entire program record
    void Clear();  // clears all data fields

    // convenience query methods
    bool HasCommandLine() const;  // returns true if program record has a command line entry
    bool HasID() const;           // returns true if program record has an ID
    bool HasName() const;         // returns true if program record has a name
    bool HasPreviousProgramID()
        const;                // returns true if program record has a 'previous program ID'
    bool HasVersion() const;  // returns true if program record has a version

    // data members
    std::string CommandLine;                  // CL:<CommandLine>
    std::string ID;                           // ID:<ID>          *Required for valid SAM header*
    std::string Name;                         // PN:<Name>
    std::string PreviousProgramID;            // PP:<PreviousProgramID>
    std::string Version;                      // VN:<Version>
    std::vector<CustomHeaderTag> CustomTags;  // optional custom tags

    // internal (non-standard) methods & fields
private:
    bool HasNextProgramID() const;
    std::string NextProgramID;
    friend class BamTools::SamProgramChain;
}